

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VScaleAddMulti_Serial(int nvec,sunrealtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  sunrealtype *zd;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype j;
  sunrealtype in_stack_00000030;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_40;
  undefined4 local_34;
  
  if (in_EDI == 1) {
    N_VLinearSum_Serial((sunrealtype)Z,(N_Vector)sunctx_local_scope_,in_stack_00000030,(N_Vector)j,
                        (N_Vector)N);
  }
  else {
    lVar1 = *(long *)*in_RDX;
    lVar2 = *(long *)(*in_RDX + 0x10);
    if (in_RCX == in_R8) {
      for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
        lVar3 = *(long *)(**(long **)(in_RCX + (long)local_34 * 8) + 0x10);
        for (local_40 = 0; local_40 < lVar1; local_40 = local_40 + 1) {
          *(double *)(lVar3 + local_40 * 8) =
               *(double *)(in_RSI + (long)local_34 * 8) * *(double *)(lVar2 + local_40 * 8) +
               *(double *)(lVar3 + local_40 * 8);
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
        lVar3 = *(long *)(**(long **)(in_RCX + (long)local_34 * 8) + 0x10);
        lVar4 = *(long *)(**(long **)(in_R8 + (long)local_34 * 8) + 0x10);
        for (local_40 = 0; local_40 < lVar1; local_40 = local_40 + 1) {
          *(double *)(lVar4 + local_40 * 8) =
               *(double *)(in_RSI + (long)local_34 * 8) * *(double *)(lVar2 + local_40 * 8) +
               *(double *)(lVar3 + local_40 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleAddMulti_Serial(int nvec, sunrealtype* a, N_Vector x,
                                   N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(x->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VLinearSum */
  if (nvec == 1)
  {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] += a[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i = 0; i < nvec; i++)
  {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = a[i] * xd[j] + yd[j]; }
  }
  return SUN_SUCCESS;
}